

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

bool __thiscall wabt::WastLexer::ReadLineComment(WastLexer *this)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = this->cursor_;
  do {
    pcVar2 = pcVar1;
    if (this->buffer_end_ <= pcVar2) goto LAB_001726d4;
    pcVar1 = pcVar2 + 1;
    this->cursor_ = pcVar1;
  } while (*pcVar2 != '\n');
  this->line_ = this->line_ + 1;
  this->line_start_ = pcVar1;
LAB_001726d4:
  return pcVar2 < this->buffer_end_;
}

Assistant:

bool WastLexer::ReadLineComment() {
  while (true) {
    switch (ReadChar()) {
      case kEof:
        return false;

      case '\n':
        Newline();
        return true;
    }
  }
}